

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_echo(CHAR_DATA *ch,char *argument)

{
  int iVar1;
  int iVar2;
  DESCRIPTOR_DATA **ppDVar3;
  char buffer [9216];
  char acStack_2438 [9224];
  
  if (*argument != '\0') {
    ppDVar3 = &descriptor_list;
    while (ppDVar3 = &((DESCRIPTOR_DATA *)ppDVar3)->next->next,
          (DESCRIPTOR_DATA *)ppDVar3 != (DESCRIPTOR_DATA *)0x0) {
      if (((DESCRIPTOR_DATA *)ppDVar3)->connected == 0) {
        colorconv(acStack_2438,argument,((DESCRIPTOR_DATA *)ppDVar3)->character);
        iVar1 = get_trust(((DESCRIPTOR_DATA *)ppDVar3)->character);
        iVar2 = get_trust(ch);
        if (iVar2 <= iVar1) {
          send_to_char(ch->name,((DESCRIPTOR_DATA *)ppDVar3)->character);
          send_to_char(" globals: ",((DESCRIPTOR_DATA *)ppDVar3)->character);
        }
        send_to_char(acStack_2438,((DESCRIPTOR_DATA *)ppDVar3)->character);
        send_to_char("\n\r",((DESCRIPTOR_DATA *)ppDVar3)->character);
      }
    }
    return;
  }
  send_to_char("Global echo what?\n\r",ch);
  return;
}

Assistant:

void do_echo(CHAR_DATA *ch, char *argument)
{
	DESCRIPTOR_DATA *d;
	char buffer[MAX_STRING_LENGTH * 2];

	if (argument[0] == '\0')
	{
		send_to_char("Global echo what?\n\r", ch);
		return;
	}

	for (d = descriptor_list; d; d = d->next)
	{
		if (d->connected == CON_PLAYING)
		{
			colorconv(buffer, argument, d->character);

			if (get_trust(d->character) >= get_trust(ch))
			{
				send_to_char(ch->name, d->character);
				send_to_char(" globals: ", d->character);
			}

			send_to_char(buffer, d->character);
			send_to_char("\n\r", d->character);
		}
	}
}